

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

double __thiscall fasttext::Meter::log(Meter *this,double __x)

{
  bool bVar1;
  size_type sVar2;
  const_iterator value;
  const_iterator this_00;
  float *pfVar3;
  mapped_type *pmVar4;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  double dVar5;
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  int *label;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  real gold;
  real score;
  pair<float,_int> *prediction;
  const_iterator __end1;
  const_iterator __begin1;
  Predictions *__range1;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *in_stack_ffffffffffffff90;
  float *in_stack_ffffffffffffff98;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> *container;
  float local_44;
  float local_40;
  float local_3c;
  reference local_38;
  pair<float,_int> *local_30;
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_28;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *local_20;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  Meter *local_8;
  
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = __x;
  this->nexamples_ = this->nexamples_ + 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = this;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  (this->metrics_).gold = sVar2 + (this->metrics_).gold;
  sVar2 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                    (local_18);
  (this->metrics_).predicted = sVar2 + (this->metrics_).predicted;
  local_20 = local_18;
  local_28._M_current =
       (pair<float,_int> *)
       std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                 ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)this);
  local_30 = (pair<float,_int> *)
             std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                       ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                        this);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                             *)in_stack_ffffffffffffff90,
                            (__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                             *)this), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
               ::operator*(&local_28);
    pmVar4 = std::
             unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
             ::operator[](in_stack_ffffffffffffff90,(key_type *)this);
    pmVar4->predicted = pmVar4->predicted + 1;
    dVar5 = std::exp((double)(ulong)(uint)local_38->first);
    local_40 = SUB84(dVar5,0);
    local_44 = 1.0;
    pfVar3 = std::min<float>(&local_40,&local_44);
    local_3c = *pfVar3;
    auVar6 = ZEXT1664((undefined1  [16])0x0);
    bVar1 = utils::contains<int>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8._M_current);
    if (bVar1) {
      pmVar4 = std::
               unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
               ::operator[](in_stack_ffffffffffffff90,(key_type *)this);
      pmVar4->predictedGold = pmVar4->predictedGold + 1;
      (this->metrics_).predictedGold = (this->metrics_).predictedGold + 1;
      auVar6 = ZEXT464(0x3f800000);
    }
    std::
    unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
    ::operator[](in_stack_ffffffffffffff90,(key_type *)this);
    std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
    emplace_back<float&,float&>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (float *)in_stack_ffffffffffffff90);
    __gnu_cxx::
    __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
    ::operator++(&local_28);
  }
  value = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)this);
  this_00 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this);
  container = local_10;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffff90,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)this), bVar1) {
    pfVar3 = (float *)__gnu_cxx::
                      __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 *)&stack0xffffffffffffffa8);
    pmVar4 = std::
             unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
             ::operator[](in_stack_ffffffffffffff90,(key_type *)this);
    pmVar4->gold = pmVar4->gold + 1;
    if (((this->falseNegativeLabels_ & 1U) != 0) &&
       (bVar1 = utils::containsSecond<float,int>
                          ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *
                           )container,value._M_current), !bVar1)) {
      std::
      unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
      ::operator[](in_stack_ffffffffffffff90,(key_type *)this);
      auVar6 = ZEXT1664(ZEXT816(0x3ff0000000000000));
      in_stack_ffffffffffffff90 =
           (unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
            *)0x3ff0000000000000;
      std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
      emplace_back<float_const&,double>
                ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                 this_00._M_current,pfVar3,(double *)0x3ff0000000000000);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffa8);
  }
  return auVar6._0_8_;
}

Assistant:

void Meter::log(
    const std::vector<int32_t>& labels,
    const Predictions& predictions) {
  nexamples_++;
  metrics_.gold += labels.size();
  metrics_.predicted += predictions.size();

  for (const auto& prediction : predictions) {
    labelMetrics_[prediction.second].predicted++;

    real score = std::min(std::exp(prediction.first), 1.0f);
    real gold = 0.0;
    if (utils::contains(labels, prediction.second)) {
      labelMetrics_[prediction.second].predictedGold++;
      metrics_.predictedGold++;
      gold = 1.0;
    }
    labelMetrics_[prediction.second].scoreVsTrue.emplace_back(score, gold);
  }

  for (const auto& label : labels) {
    labelMetrics_[label].gold++;
    if (falseNegativeLabels_) {
      if (!utils::containsSecond(predictions, label)) {
        labelMetrics_[label].scoreVsTrue.emplace_back(falseNegativeScore, 1.0);
      }
    }
  }
}